

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rebuildPage(MemPage *pPg,int nCell,u8 **apCell,u16 *szCell)

{
  u32 uVar1;
  u8 *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  u8 *local_78;
  u8 *pCell;
  u8 *pData;
  u8 *pTmp;
  u8 *pCellptr;
  int i;
  u8 *pEnd;
  int usableSize;
  u8 *aData;
  int hdr;
  u16 *szCell_local;
  u8 **apCell_local;
  int nCell_local;
  MemPage *pPg_local;
  
  uVar3 = (uint)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar1 = pPg->pBt->usableSize;
  pTmp = pPg->aCellIdx;
  pvVar6 = sqlite3PagerTempSpace(pPg->pBt->pPager);
  uVar4 = (uint)CONCAT11(puVar2[(int)(uVar3 + 5)],puVar2[(long)(int)(uVar3 + 5) + 1]);
  memcpy((void *)((long)pvVar6 + (long)(int)uVar4),puVar2 + (int)uVar4,(long)(int)(uVar1 - uVar4));
  pCellptr._4_4_ = 0;
  pCell = puVar2 + (int)uVar1;
  while( true ) {
    if (nCell <= pCellptr._4_4_) {
      pPg->nCell = (u16)nCell;
      pPg->nOverflow = '\0';
      puVar2[(int)(uVar3 + 1)] = '\0';
      puVar2[(long)(int)(uVar3 + 1) + 1] = '\0';
      puVar2[(int)(uVar3 + 3)] = (u8)(pPg->nCell >> 8);
      puVar2[(long)(int)(uVar3 + 3) + 1] = (u8)pPg->nCell;
      puVar2[(int)(uVar3 + 5)] = (u8)((ulong)((long)pCell - (long)puVar2) >> 8);
      puVar2[(long)(int)(uVar3 + 5) + 1] = (char)pCell - (char)puVar2;
      puVar2[(int)(uVar3 + 7)] = '\0';
      return 0;
    }
    local_78 = apCell[pCellptr._4_4_];
    if ((puVar2 <= local_78) && (local_78 < puVar2 + (int)uVar1)) {
      local_78 = (u8 *)((long)pvVar6 + ((long)local_78 - (long)puVar2));
    }
    pCell = pCell + -(long)(int)(uint)szCell[pCellptr._4_4_];
    *pTmp = (u8)((ulong)((long)pCell - (long)puVar2) >> 8);
    pTmp[1] = (char)pCell - (char)puVar2;
    pTmp = pTmp + 2;
    if (pCell < pTmp) break;
    memcpy(pCell,local_78,(ulong)szCell[pCellptr._4_4_]);
    pCellptr._4_4_ = pCellptr._4_4_ + 1;
  }
  iVar5 = sqlite3CorruptError(0xff50);
  return iVar5;
}

Assistant:

static int rebuildPage(
  MemPage *pPg,                   /* Edit this page */
  int nCell,                      /* Final number of cells on page */
  u8 **apCell,                    /* Array of cells */
  u16 *szCell                     /* Array of cell sizes */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i;
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;

  i = get2byte(&aData[hdr+5]);
  memcpy(&pTmp[i], &aData[i], usableSize - i);

  pData = pEnd;
  for(i=0; i<nCell; i++){
    u8 *pCell = apCell[i];
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      pCell = &pTmp[pCell - aData];
    }
    pData -= szCell[i];
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, szCell[i]);
    assert( szCell[i]==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( szCell[i]!=pPg->xCellSize(pPg,pCell) );
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}